

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

int WriteLE(FILE *out,uint32_t val,int num)

{
  size_t sVar1;
  int in_EDX;
  uint in_ESI;
  FILE *in_RDI;
  int i;
  uint8_t buf [4];
  int local_18;
  undefined1 local_14 [4];
  int local_10;
  uint local_c;
  FILE *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
    local_14[local_18] = (char)local_c;
    local_c = local_c >> 8;
  }
  sVar1 = fwrite(local_14,(long)local_10,1,local_8);
  return (int)(sVar1 == 1);
}

Assistant:

static int WriteLE(FILE* const out, uint32_t val, int num) {
  uint8_t buf[4];
  int i;
  for (i = 0; i < num; ++i) {
    buf[i] = (uint8_t)(val & 0xff);
    val >>= 8;
  }
  return (fwrite(buf, num, 1, out) == 1);
}